

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O1

text_style * __thiscall fmt::v5::text_style::operator|=(text_style *this,text_style *rhs)

{
  color_union *pcVar1;
  format_error *this_00;
  
  if (this->set_foreground_color == false) {
    this->set_foreground_color = rhs->set_foreground_color;
    this->foreground_color = rhs->foreground_color;
  }
  else if (rhs->set_foreground_color != false) {
    if (((this->foreground_color).is_rgb != true) || ((rhs->foreground_color).is_rgb == false)) {
      this_00 = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this_00,"can\'t OR a terminal color");
      goto LAB_00112e59;
    }
    pcVar1 = &(this->foreground_color).value;
    pcVar1->rgb_color = pcVar1->rgb_color | (rhs->foreground_color).value.rgb_color;
  }
  if (this->set_background_color == false) {
    this->set_background_color = rhs->set_background_color;
    this->background_color = rhs->background_color;
  }
  else if (rhs->set_background_color != false) {
    if (((this->background_color).is_rgb != true) || ((rhs->background_color).is_rgb == false)) {
      this_00 = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this_00,"can\'t OR a terminal color");
LAB_00112e59:
      __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = &(this->background_color).value;
    pcVar1->rgb_color = pcVar1->rgb_color | (rhs->background_color).value.rgb_color;
  }
  this->ems = this->ems | rhs->ems;
  return this;
}

Assistant:

FMT_CONSTEXPR text_style &operator|=(const text_style &rhs) {
    if (!set_foreground_color) {
      set_foreground_color = rhs.set_foreground_color;
      foreground_color = rhs.foreground_color;
    } else if (rhs.set_foreground_color) {
      if (!foreground_color.is_rgb || !rhs.foreground_color.is_rgb)
        throw format_error("can't OR a terminal color");
      foreground_color.value.rgb_color |= rhs.foreground_color.value.rgb_color;
    }

    if (!set_background_color) {
      set_background_color = rhs.set_background_color;
      background_color = rhs.background_color;
    } else if (rhs.set_background_color) {
      if (!background_color.is_rgb || !rhs.background_color.is_rgb)
        throw format_error("can't OR a terminal color");
      background_color.value.rgb_color |= rhs.background_color.value.rgb_color;
    }

    ems = static_cast<emphasis>(static_cast<uint8_t>(ems) |
                                static_cast<uint8_t>(rhs.ems));
    return *this;
  }